

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getNumberOfLinesRange
          (LineRenderCase *this,int queryAreaBegin,int queryAreaEnd,float patternStart,
          float patternSize,int viewportArea,QueryDirection queryDir)

{
  byte bVar1;
  undefined4 in_register_00000034;
  long lVar2;
  int in_R9D;
  float fVar3;
  float local_70;
  float local_6c;
  float lineWidth;
  float linePos;
  int lineNdx;
  int numLinesMax;
  int numLinesMin;
  int patternEndNdx;
  int patternStartNdx;
  QueryDirection queryDir_local;
  int viewportArea_local;
  float patternSize_local;
  float patternStart_local;
  int queryAreaEnd_local;
  int queryAreaBegin_local;
  LineRenderCase *this_local;
  
  lVar2 = CONCAT44(in_register_00000034,queryAreaBegin);
  if (in_R9D == 0) {
    bVar1 = *(byte *)(lVar2 + 0x81);
  }
  else {
    bVar1 = *(byte *)(lVar2 + 0x80);
  }
  local_6c = (float)(uint)((bVar1 & 1) != 0);
  lineNdx = 0;
  linePos = 0.0;
  for (lineWidth = local_6c; (int)lineWidth < (int)local_6c + *(int *)(lVar2 + 0xd4);
      lineWidth = (float)((int)lineWidth + 1)) {
    fVar3 = (((float)(int)lineWidth / (float)*(int *)(lVar2 + 0xd4)) * patternSize + patternStart) *
            0.5 + 0.5;
    if ((*(byte *)(lVar2 + 0xd8) & 1) == 0) {
      local_70 = 1.0;
    }
    else {
      local_70 = (float)*(int *)(lVar2 + 0xdc);
    }
    if ((fVar3 * (float)(int)queryDir <= (float)queryAreaEnd + 1.0) ||
       ((float)viewportArea - 1.0 <= fVar3 * (float)(int)queryDir)) {
      if (((-local_70 * 0.5 + (float)queryAreaEnd) - 1.0 < fVar3 * (float)(int)queryDir) &&
         (fVar3 * (float)(int)queryDir < local_70 * 0.5 + (float)viewportArea + 1.0)) {
        linePos = (float)((int)linePos + 1);
      }
    }
    else {
      lineNdx = lineNdx + 1;
      linePos = (float)((int)linePos + 1);
    }
  }
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,lineNdx,(int)linePos);
  return (IVec2)(int  [2])this;
}

Assistant:

tcu::IVec2 LineRenderCase::getNumberOfLinesRange (int queryAreaBegin, int queryAreaEnd, float patternStart, float patternSize, int viewportArea, QueryDirection queryDir) const
{
	// pattern is not symmetric due to mirroring
	const int	patternStartNdx	= (queryDir == DIRECTION_HORIZONTAL) ? ((m_hasGeometryStage) ? (1) : (0)) : ((m_hasTessellationStage) ? (1) : (0));
	const int	patternEndNdx	= patternStartNdx + m_patternSide;

	int			numLinesMin		= 0;
	int			numLinesMax		= 0;

	for (int lineNdx = patternStartNdx; lineNdx < patternEndNdx; ++lineNdx)
	{
		const float linePos		= (patternStart + (float(lineNdx) / float(m_patternSide)) * patternSize) * 0.5f + 0.5f;
		const float lineWidth	= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);

		if (linePos * (float)viewportArea > (float)queryAreaBegin + 1.0f &&
			linePos * (float)viewportArea < (float)queryAreaEnd   - 1.0f)
		{
			// line center is within the area
			++numLinesMin;
			++numLinesMax;
		}
		else if (linePos * (float)viewportArea > (float)queryAreaBegin - lineWidth*0.5f - 1.0f &&
		         linePos * (float)viewportArea < (float)queryAreaEnd   + lineWidth*0.5f + 1.0f)
		{
			// line could leak into area
			++numLinesMax;
		}
	}

	return tcu::IVec2(numLinesMin, numLinesMax);
}